

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O2

void __thiscall
StringEqualFailure::StringEqualFailure
          (StringEqualFailure *this,UtestShell *test,char *fileName,int lineNumber,char *expected,
          char *actual,SimpleString *text)

{
  SimpleString *this_00;
  long lVar1;
  long lVar2;
  SimpleString *expected_00;
  long lVar3;
  long lVar4;
  SimpleString local_40;
  SimpleString local_38;
  SimpleString local_30;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_001e0d00;
  TestFailure::createUserText((TestFailure *)&local_40,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,&local_40);
  SimpleString::~SimpleString(&local_40);
  StringFromOrNull((char *)&local_38);
  expected_00 = (SimpleString *)actual;
  StringFromOrNull((char *)&local_30);
  TestFailure::createButWasString((TestFailure *)&local_40,expected_00,&local_38);
  SimpleString::operator+=(this_00,&local_40);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_38);
  if (actual != (char *)0x0 && expected != (char *)0x0) {
    lVar3 = -1;
    do {
      lVar1 = lVar3 + 1;
      lVar4 = lVar3 + 1;
      lVar2 = lVar3 + 1;
      lVar3 = lVar4;
    } while (actual[lVar1] == expected[lVar2]);
    SimpleString::SimpleString(&local_38,actual);
    TestFailure::createDifferenceAtPosString
              ((TestFailure *)&local_40,(SimpleString *)actual,(size_t)&local_38,
               (DifferenceFormat)lVar4);
    SimpleString::operator+=(this_00,&local_40);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_38);
  }
  return;
}

Assistant:

StringEqualFailure::StringEqualFailure(UtestShell* test, const char* fileName, int lineNumber, const char* expected, const char* actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFromOrNull(expected), StringFromOrNull(actual));
    if((expected) && (actual))
    {
        size_t failStart;
        for (failStart = 0; actual[failStart] == expected[failStart]; failStart++)
            ;
        message_ += createDifferenceAtPosString(actual, failStart);
    }
}